

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

bool __thiscall Json::StreamWriterBuilder::validate(StreamWriterBuilder *this,Value *invalid)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ArrayIndex AVar2;
  iterator iVar3;
  Value *pVVar4;
  long lVar5;
  key_type *__k;
  long lVar6;
  Members keys;
  size_type __dnew;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid_keys;
  Value my_invalid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  pointer local_c0;
  Value *local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  Value local_80;
  Value local_58;
  
  Value::Value(&local_80,nullValue);
  local_b8 = invalid;
  if (invalid == (Value *)0x0) {
    local_b8 = &local_80;
  }
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_b0);
  paVar1 = &local_e0.field_2;
  local_e0.field_2._M_allocated_capacity._0_7_ = 0x61746e65646e69;
  local_e0.field_2._M_local_buf[7] = 't';
  local_e0.field_2._8_2_ = 0x6f69;
  local_e0.field_2._M_local_buf[10] = 'n';
  local_e0._M_string_length = 0xb;
  local_e0.field_2._M_local_buf[0xb] = '\0';
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_b0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT17(local_e0.field_2._M_local_buf[7],
                             local_e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_e0.field_2._M_allocated_capacity._0_7_ = 0x746e656d6d6f63;
  local_e0.field_2._M_local_buf[7] = 'S';
  local_e0.field_2._8_2_ = 0x7974;
  local_e0.field_2._M_local_buf[10] = 'l';
  local_e0.field_2._M_local_buf[0xb] = 'e';
  local_e0._M_string_length = (size_type)&DAT_0000000c;
  local_e0.field_2._M_local_buf[0xc] = '\0';
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_b0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT17(local_e0.field_2._M_local_buf[7],
                             local_e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_c0 = (pointer)0x17;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  local_e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e0,(ulong)&local_c0);
  local_e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_c0,0);
  local_e0.field_2._M_local_buf[7] = (char)((ulong)local_c0 >> 0x38);
  builtin_strncpy(local_e0._M_dataplus._M_p,"enableYAMLCompatibility",0x17);
  local_e0._M_string_length = (size_type)local_c0;
  local_e0._M_dataplus._M_p[(long)local_c0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_b0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT17(local_e0.field_2._M_local_buf[7],
                             local_e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_c0 = (pointer)0x14;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  local_e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e0,(ulong)&local_c0);
  local_e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_c0,0);
  local_e0.field_2._M_local_buf[7] = (char)((ulong)local_c0 >> 0x38);
  builtin_strncpy(local_e0._M_dataplus._M_p,"dropNullPlaceholders",0x14);
  local_e0._M_string_length = (size_type)local_c0;
  local_e0._M_dataplus._M_p[(long)local_c0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_b0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT17(local_e0.field_2._M_local_buf[7],
                             local_e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_c0 = (pointer)0x10;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  local_e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e0,(ulong)&local_c0);
  local_e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_c0,0);
  local_e0.field_2._M_local_buf[7] = (char)((ulong)local_c0 >> 0x38);
  builtin_strncpy(local_e0._M_dataplus._M_p,"useSpecialFloats",0x10);
  local_e0._M_string_length = (size_type)local_c0;
  local_e0._M_dataplus._M_p[(long)local_c0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_b0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT17(local_e0.field_2._M_local_buf[7],
                             local_e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_e0.field_2._M_allocated_capacity._0_7_ = 0x69736963657270;
  local_e0.field_2._M_local_buf[7] = 'o';
  local_e0.field_2._8_2_ = 0x6e;
  local_e0._M_string_length = 9;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_b0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT17(local_e0.field_2._M_local_buf[7],
                             local_e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  Value::getMemberNames_abi_cxx11_((Members *)&local_e0,&this->settings_);
  if (local_e0._M_string_length - (long)local_e0._M_dataplus._M_p != 0) {
    lVar6 = (long)(local_e0._M_string_length - (long)local_e0._M_dataplus._M_p) >> 5;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    lVar5 = 0;
    do {
      __k = (key_type *)(local_e0._M_dataplus._M_p + lVar5);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_b0,__k);
      if ((_Rb_tree_header *)iVar3._M_node == &local_b0._M_impl.super__Rb_tree_header) {
        pVVar4 = Value::operator[](&this->settings_,__k);
        Value::Value(&local_58,pVVar4);
        pVVar4 = Value::operator[](local_b8,__k);
        Value::operator=(pVVar4,&local_58);
        Value::~Value(&local_58);
      }
      lVar5 = lVar5 + 0x20;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  AVar2 = Value::size(local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_b0);
  Value::~Value(&local_80);
  return AVar2 == 0;
}

Assistant:

bool StreamWriterBuilder::validate(Json::Value* invalid) const
{
  Json::Value my_invalid;
  if (!invalid) invalid = &my_invalid;  // so we do not need to test for NULL
  Json::Value& inv = *invalid;
  std::set<JSONCPP_STRING> valid_keys;
  getValidWriterKeys(&valid_keys);
  Value::Members keys = settings_.getMemberNames();
  size_t n = keys.size();
  for (size_t i = 0; i < n; ++i) {
    JSONCPP_STRING const& key = keys[i];
    if (valid_keys.find(key) == valid_keys.end()) {
      inv[key] = settings_[key];
    }
  }
  return 0u == inv.size();
}